

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1driver.c
# Opt level: O3

FT_UInt t1_get_name_index(T1_Face face,FT_String *glyph_name)

{
  FT_String **ppFVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)(face->type1).num_glyphs;
  if (0 < lVar4) {
    ppFVar1 = (face->type1).glyph_names;
    lVar3 = 0;
    do {
      iVar2 = strcmp(glyph_name,ppFVar1[lVar3]);
      if (iVar2 == 0) goto LAB_002314c2;
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  lVar3 = 0;
LAB_002314c2:
  return (FT_UInt)lVar3;
}

Assistant:

static FT_UInt
  t1_get_name_index( T1_Face     face,
                     FT_String*  glyph_name )
  {
    FT_Int  i;


    for ( i = 0; i < face->type1.num_glyphs; i++ )
    {
      FT_String*  gname = face->type1.glyph_names[i];


      if ( !ft_strcmp( glyph_name, gname ) )
        return (FT_UInt)i;
    }

    return 0;
  }